

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int processInputFile(string *in_file_path)

{
  uint nFrames;
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  uchar *dpcm_buff;
  uint32_t i_1;
  uint uVar5;
  uint32_t i;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  StkFloat SVar16;
  allocator local_199;
  double local_198;
  StkFrames preprocess_buff;
  string in_file_name;
  FileRead in_file;
  StkError err;
  string local_c8;
  StkFrames floatbuff;
  string local_78 [32];
  StkFrames progress_out_buff;
  
  in_file_name._M_dataplus._M_p = (pointer)&in_file_name.field_2;
  in_file_name._M_string_length = 0;
  in_file_name.field_2._M_local_buf[0] = '\0';
  getFileNameDeletingDirectory(in_file_path,&in_file_name);
  poVar4 = std::operator<<((ostream *)&std::cout,"----------------------------------");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"input file: ");
  poVar4 = std::operator<<(poVar4,(string *)in_file_path);
  std::endl<char,std::char_traits<char>>(poVar4);
  stk::FileRead::FileRead(&in_file);
  std::__cxx11::string::string(local_78,(string *)in_file_path);
  stk::FileRead::open(&in_file,(char *)local_78,0,0x40d5888000000000,1,2);
  std::__cxx11::string::~string(local_78);
  local_198 = in_file.fileRate_;
  nFrames = (uint)in_file.fileSize_;
  stk::StkFrames::StkFrames((StkFrames *)&err,nFrames,in_file.channels_);
  stk::FileRead::read(&in_file,(int)&err,(void *)0x0,0);
  if (in_file.dataType_ == 2) {
    dVar14 = 32768.0;
  }
  else {
    dVar14 = *(double *)(&DAT_001101a0 + (ulong)(in_file.dataType_ == 1) * 8);
  }
  if (in_file.dataType_ == 4) {
    dVar14 = 8388608.0;
  }
  if (in_file.dataType_ == 8) {
    dVar14 = 2147483648.0;
  }
  uVar12 = (ulong)in_file.channels_;
  stk::StkFrames::StkFrames(&floatbuff,nFrames,1);
  uVar11 = in_file.fileSize_ & 0xffffffff;
  uVar5 = 0;
  for (uVar6 = 0; uVar6 != uVar11; uVar6 = uVar6 + 1) {
    floatbuff.data_[uVar6] = 0.0;
    dVar15 = 0.0;
    uVar9 = (ulong)in_file.channels_;
    uVar8 = uVar5;
    while( true ) {
      bVar13 = uVar9 == 0;
      uVar9 = uVar9 - 1;
      if (bVar13) break;
      dVar15 = dVar15 + ((double)err._vptr_StkError[uVar8] / (dVar14 * (double)uVar12)) * wave_gain;
      floatbuff.data_[uVar6] = dVar15;
      uVar8 = uVar8 + 1;
    }
    uVar5 = uVar5 + in_file.channels_;
  }
  if (1 < in_file.channels_) {
    poVar4 = std::operator<<((ostream *)&std::cout,"convert ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," channels to mono.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  dVar14 = 1789772.5 / (double)sample_rate_cycles[sample_rate_ind];
  uVar5 = (uint)(((double)uVar11 * dVar14) / local_198 + 1.0);
  stk::StkFrames::StkFrames(&preprocess_buff,uVar5,1);
  if (no_resampling == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"no resampling.");
    std::endl<char,std::char_traits<char>>(poVar4);
    stk::StkFrames::resize(&preprocess_buff,(long)(int)nFrames,1);
    for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
      preprocess_buff.data_[uVar6] = floatbuff.data_[uVar6];
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"resample ");
    poVar4 = std::ostream::_M_insert<double>(local_198);
    std::operator<<(poVar4,"Hz to ");
    poVar4 = std::ostream::_M_insert<double>(dVar14);
    poVar4 = std::operator<<(poVar4,"Hz");
    std::endl<char,std::char_traits<char>>(poVar4);
    nFrames = resample(&floatbuff,local_198,&preprocess_buff,uVar5,dVar14,0.995,0x100);
    stk::StkFrames::resize(&preprocess_buff,(long)(int)nFrames,1);
  }
  stk::Stk::setSampleRate(dVar14);
  preprocessInputBuffer
            (&in_file_name,&preprocess_buff,dVar14,shifter_weight,center_bias_level,
             use_linearity_correction);
  if (output_preprocessed == true) {
    stk::StkFrames::StkFrames(&progress_out_buff,(uint)preprocess_buff.size_,1);
    for (lVar7 = 0; CONCAT44(preprocess_buff.size_._4_4_,(uint)preprocess_buff.size_) != lVar7;
        lVar7 = lVar7 + 1) {
      dVar15 = preprocess_buff.data_[lVar7];
      progress_out_buff.data_[lVar7] = dVar15;
      SVar16 = 1.0;
      if ((1.0 < dVar15) || (SVar16 = -1.0, dVar15 < -1.0)) {
        progress_out_buff.data_[lVar7] = SVar16;
      }
    }
    std::__cxx11::string::string((string *)&local_c8,"_processed",&local_199);
    outputBufferToFile(&in_file_name,&progress_out_buff,&local_c8,dVar14);
    std::__cxx11::string::~string((string *)&local_c8);
    stk::StkFrames::~StkFrames(&progress_out_buff);
  }
  iVar10 = (int)(nFrames + 0x7f) / 0x80 << 4;
  iVar1 = -1;
  if (-0xff < (int)nFrames) {
    iVar1 = iVar10;
  }
  dpcm_buff = (uchar *)operator_new__((long)iVar1);
  if (force_initial_volume < 0) {
    dVar15 = *preprocess_buff.data_ * 64.0;
  }
  else {
    dVar15 = (double)((uint)force_initial_volume >> 1);
  }
  iVar1 = 0;
  if (0 < (int)dVar15 * 2) {
    iVar1 = (int)dVar15 * 2;
  }
  iVar10 = encodeDpcm(&preprocess_buff,iVar1,dpcm_buff,iVar10,dither_mode,noise_shape_mode,false);
  iVar2 = decodeDpcm(&in_file_name,dpcm_buff,iVar10,iVar1,center_bias_level,output_encoded_wav,
                     dVar14);
  iVar3 = outputDpcmToFile(&in_file_name,dpcm_buff,iVar10,iVar1);
  if (iVar3 == 0) {
    operator_delete__(dpcm_buff);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10 / 8);
    std::operator<<(poVar4," bytes");
    poVar4 = std::operator<<((ostream *)&std::cout,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,nFrames);
    poVar4 = std::operator<<(poVar4,"samples+");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar10 - nFrames);
    poVar4 = std::operator<<(poVar4,"samples padding)");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"initial volume: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"max volume: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    stk::StkFrames::~StkFrames(&preprocess_buff);
    stk::StkFrames::~StkFrames(&floatbuff);
    stk::StkFrames::~StkFrames((StkFrames *)&err);
    stk::FileRead::~FileRead(&in_file);
    std::__cxx11::string::~string((string *)&in_file_name);
    return 0;
  }
  exit(1);
}

Assistant:

int processInputFile(const std::string &in_file_path)
{
	std::string in_file_name;
	getFileNameDeletingDirectory(in_file_path, in_file_name);
	
	std::cout << "----------------------------------" << std::endl;
	std::cout << "input file: " << in_file_path << std::endl;
	
	// 入力ファイルを読み込む
	stk::FileRead in_file;
	try {
		in_file.open(in_file_path);
	}
	catch(stk::StkError err) {
		std::cout << "can not open file: " << in_file_path << std::endl;
		exit(1);
	}
	uint32_t		in_frames = static_cast<uint32_t>(in_file.fileSize());
	stk::StkFloat	in_samplerate = in_file.fileRate();
	stk::StkFrames	filebuff(in_frames, in_file.channels());
	in_file.read(filebuff, 0, false);
	
	// モノラル、float型フォーマットに変換する
	double normalize_gain = 1.0;
	if (in_file.format() == stk::FileRead::STK_SINT8) {
		normalize_gain = 128.0;
	}
	if (in_file.format() == stk::FileRead::STK_SINT16) {
		normalize_gain = 32768.0;
	}
	if (in_file.format() == stk::FileRead::STK_SINT24) {
		normalize_gain = 8388608.0;
	}
	if (in_file.format() == stk::FileRead::STK_SINT32) {
		normalize_gain = 2147483648.0;
	}
	normalize_gain *= in_file.channels();

	stk::StkFrames	floatbuff(in_frames, 1);
	for (uint32_t i=0; i<in_frames; ++i) {
		floatbuff[i] = 0;
		for (unsigned int ch=0; ch<in_file.channels(); ++ch) {
			floatbuff[i] += (filebuff[i*in_file.channels() + ch] / normalize_gain) * wave_gain;
		}
	}
	if (in_file.channels() > 1) {
		std::cout << "convert " << in_file.channels() << " channels to mono." << std::endl;
	}
	
	// 目的のDPCMのサンプリングレートに変換
	double dst_rate = dpcmSampleRateValue(sample_rate_ind);
	int	src_frames = static_cast<int>(in_frames * dst_rate / in_samplerate + 1);
	stk::StkFrames preprocess_buff(src_frames, 1);
	
	if (no_resampling) {
		std::cout << "no resampling." << std::endl;
		src_frames = in_frames;
		preprocess_buff.resize(src_frames);
		for (uint32_t i=0; i<in_frames; ++i) {
			preprocess_buff[i] = floatbuff[i];
		}
		src_frames = in_frames;
	}
	else {
		std::cout << "resample " << in_samplerate << "Hz to " << dst_rate << "Hz" << std::endl;
		src_frames = resample(floatbuff, in_samplerate, preprocess_buff,
							  src_frames, dst_rate, 0.995, resample_window_len);
		preprocess_buff.resize(src_frames);
	}
	
	
	// stkの動作サンプリングレートを変更する
	stk::Stk::setSampleRate(dst_rate);
	
	// 波形の前処理を行う
	preprocessInputBuffer(in_file_name, preprocess_buff, dst_rate,
						  shifter_weight, center_bias_level,
						  use_linearity_correction);
	
	if (output_preprocessed) {
		// 中心補正済み波形を出力
		stk::StkFrames	progress_out_buff((uint32_t)preprocess_buff.size(), 1);
		for (size_t i=0; i<preprocess_buff.size(); ++i) {
			progress_out_buff[i] = preprocess_buff[i];
			if (progress_out_buff[i] > 1.0) progress_out_buff[i] = 1.0;
			if (progress_out_buff[i] < -1.0) progress_out_buff[i] = -1.0;
		}
		outputBufferToFile(in_file_name, progress_out_buff, "_processed", dst_rate);
	}
	
	// DPCM変換の開始
	// サイズは16byte=128sample境界に合うように切り上げ
	int dpcm_frames = ((src_frames + 127) / 128) * 128;
	unsigned char *dpcm = new unsigned char[dpcm_frames / 8];
	int dpcm_initial_volume = 2*static_cast<int>((force_initial_volume >= 0)?(force_initial_volume/2):(preprocess_buff[0] * 64.0));
	if (dpcm_initial_volume < 0) {
		dpcm_initial_volume = 0;
	}
	dpcm_frames = encodeDpcm(preprocess_buff, dpcm_initial_volume,
							 dpcm, dpcm_frames/8, dither_mode, noise_shape_mode,
							 use_linearity_correction);
	
	// 波形最大値を求めるために復号する
	int volume_max = decodeDpcm(in_file_name, dpcm, dpcm_frames, dpcm_initial_volume, center_bias_level, output_encoded_wav, dst_rate);
	
	// dmcファイル出力
	if (outputDpcmToFile(in_file_name, dpcm, dpcm_frames, dpcm_initial_volume)) {
		exit(1);
	}
	
	delete [] dpcm;
	
	std::cout << dpcm_frames/8 << " bytes";
	std::cout << "(" << src_frames << "samples+" << (dpcm_frames - src_frames) << "samples padding)" << std::endl;
	std::cout << "initial volume: " << dpcm_initial_volume << std::endl;
	std::cout << "max volume: " << volume_max << std::endl;
	
	return 0;
}